

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::NodeImpl::getHeaderTip(NodeImpl *this,int *height,int64_t *block_time)

{
  CBlockIndex *pCVar1;
  ChainstateManager *pCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x11c,false);
  pCVar2 = chainman(this);
  pCVar1 = pCVar2->m_best_header;
  if (pCVar1 != (CBlockIndex *)0x0) {
    *height = pCVar1->nHeight;
    *block_time = (ulong)pCVar1->nTime;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pCVar1 != (CBlockIndex *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool getHeaderTip(int& height, int64_t& block_time) override
    {
        LOCK(::cs_main);
        auto best_header = chainman().m_best_header;
        if (best_header) {
            height = best_header->nHeight;
            block_time = best_header->GetBlockTime();
            return true;
        }
        return false;
    }